

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

int nuraft::buffer::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0x7fffffff;
  if (-1 < (int)*__child_stack) {
    uVar2 = 0xffff;
  }
  alloc((buffer *)__fn,(ulong)(uVar2 & *__child_stack));
  uVar2 = *__child_stack;
  uVar3 = 0x7fffffff;
  if (-1 < (int)uVar2) {
    uVar3 = 0xffff;
  }
  memcpy(*(uint **)__fn + (ulong)(**(uint **)__fn >> 0x1f) + 1,
         (void *)((long)__child_stack + (ulong)(uVar2 >> 0x1f) * 4 + 4),(ulong)(uVar3 & uVar2));
  piVar1 = *(int **)__fn;
  if (*piVar1 < 0) {
    piVar1[1] = 0;
  }
  else {
    *(undefined2 *)((long)piVar1 + 2) = 0;
  }
  return (int)__fn;
}

Assistant:

ptr<buffer> buffer::clone(const buffer& buf) {
    ptr<buffer> other = alloc(buf.size());

    byte* dst = other->data_begin();
    byte* src = buf.data_begin();
    ::memcpy(dst, src, buf.size());

    other->pos(0);
    return other;
}